

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O0

bool wabt::anon_unknown_0::FloatParser<double>::StringStartsWith(char *start,char *end,char *prefix)

{
  bool bVar1;
  char *local_28;
  char *prefix_local;
  char *end_local;
  char *start_local;
  
  local_28 = prefix;
  end_local = start;
  while( true ) {
    bVar1 = false;
    if (end_local < end) {
      bVar1 = *local_28 != '\0';
    }
    if (!bVar1) break;
    if (*end_local != *local_28) {
      return false;
    }
    end_local = end_local + 1;
    local_28 = local_28 + 1;
  }
  return *local_28 == '\0';
}

Assistant:

bool FloatParser<T>::StringStartsWith(const char* start,
                                      const char* end,
                                      const char* prefix) {
  while (start < end && *prefix) {
    if (*start != *prefix) {
      return false;
    }
    start++;
    prefix++;
  }
  return *prefix == 0;
}